

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O3

void __thiscall
libebml::EbmlMaster::Read
          (EbmlMaster *this,EbmlStream *inDataStream,EbmlSemanticContext *sContext,
          int *UpperEltFound,EbmlElement **FoundElt,bool AllowDummyElt,ScopeMode ReadFully)

{
  pointer *pppEVar1;
  uint64 uVar2;
  uint64 uVar3;
  iterator __position;
  EbmlElement *pEVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined3 uVar9;
  int iVar10;
  int iVar11;
  pointer ppEVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppEVar13;
  pointer ppEVar14;
  byte bVar15;
  undefined7 in_register_00000089;
  uint64 uVar16;
  ulong uVar17;
  EbmlElement *local_60;
  uint local_58;
  uint local_54;
  EbmlElement **local_50;
  EbmlSemanticContext *local_48;
  vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *local_40;
  EbmlStream *local_38;
  
  local_54 = (uint)CONCAT71(in_register_00000089,AllowDummyElt);
  if (ReadFully == SCOPE_NO_DATA) {
    return;
  }
  ppEVar12 = (this->ElementList).
             super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar13 = (this->ElementList).
             super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_50 = FoundElt;
  local_48 = sContext;
  if (ppEVar13 != ppEVar12) {
    uVar17 = 0;
    do {
      if (ppEVar12[uVar17]->bLocked == false) {
        (*ppEVar12[uVar17]->_vptr_EbmlElement[1])();
        ppEVar12 = (this->ElementList).
                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppEVar13 = (this->ElementList).
                   super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)ppEVar13 - (long)ppEVar12 >> 3));
  }
  if (ppEVar13 != ppEVar12) {
    (this->ElementList).
    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar12;
  }
  uVar16 = 0x7fffffff;
  if ((this->super_EbmlElement).bSizeIsFinite == true) {
    iVar10 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    uVar16 = CONCAT44(extraout_var,iVar10);
    if (uVar16 == 0) goto LAB_001857cc;
  }
  (*inDataStream->Stream->_vptr_IOCallback[3])
            (inDataStream->Stream,
             (long)(this->super_EbmlElement).SizeLength + (this->super_EbmlElement).SizePosition,0);
  local_58 = local_54 & 0xff;
  local_60 = EbmlStream::FindNextElement
                       (inDataStream,local_48,UpperEltFound,uVar16,(bool)(char)local_54,1);
  if (local_60 != (EbmlElement *)0x0) {
    local_40 = (vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *)
               &this->ElementList;
    local_38 = inDataStream;
    do {
      if (0 < *UpperEltFound) goto LAB_001857c4;
      if (((this->super_EbmlElement).bSizeIsFinite == true) && (local_60->bSizeIsFinite == true)) {
        uVar16 = (this->super_EbmlElement).SizePosition;
        iVar10 = CodedSizeLength((this->super_EbmlElement).Size,(this->super_EbmlElement).SizeLength
                                 ,true);
        pEVar4 = local_60;
        if (local_60->bSizeIsFinite == false) {
          __assert_fail("bSizeIsFinite",
                        "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/./ebml/EbmlElement.h"
                        ,0x1d1,"uint64 libebml::EbmlElement::GetEndPosition() const");
        }
        uVar2 = local_60->SizePosition;
        uVar3 = (this->super_EbmlElement).Size;
        iVar11 = CodedSizeLength(local_60->Size,local_60->SizeLength,true);
        uVar16 = (uVar16 + (long)iVar10 + uVar3) - ((long)iVar11 + uVar2 + pEVar4->Size);
      }
      if (((char)local_54 == '\0') &&
         (iVar10 = (*local_60->_vptr_EbmlElement[0xd])(local_60), (char)iVar10 != '\0')) {
        if (local_60->bSizeIsFinite != true) {
          (*local_60->_vptr_EbmlElement[1])(local_60);
          break;
        }
        EbmlElement::SkipData(local_60,inDataStream,local_48,(EbmlElement *)0x0,false);
        if (local_60 != (EbmlElement *)0x0) goto LAB_0018570b;
      }
      else {
        pEVar4 = local_60;
        iVar10 = (*local_60->_vptr_EbmlElement[4])(local_60);
        inDataStream = local_38;
        (*pEVar4->_vptr_EbmlElement[0xb])
                  (pEVar4,local_38,*(undefined8 *)(CONCAT44(extraout_var_00,iVar10) + 0x18),
                   UpperEltFound,local_50,(ulong)local_58,ReadFully);
        bVar15 = ReadFully != SCOPE_ALL_DATA | local_60->bValueIsSet;
        if (bVar15 == 1) {
          __position._M_current =
               (this->ElementList).
               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>::
            _M_realloc_insert<libebml::EbmlElement*const&>(local_40,__position,&local_60);
          }
          else {
            *__position._M_current = local_60;
            pppEVar1 = &(this->ElementList).
                        super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppEVar1 = *pppEVar1 + 1;
          }
          if (local_60->bSizeIsFinite == false) {
LAB_0018578a:
            iVar10 = *UpperEltFound;
            if (((iVar10 == 0) || (*UpperEltFound = iVar10 + -1, 1 < iVar10)) || (uVar16 == 0))
            goto LAB_001857cc;
            local_60 = *local_50;
            break;
          }
        }
        else if (local_60->bSizeIsFinite != true) {
          (*local_60->_vptr_EbmlElement[1])(local_60);
          goto LAB_0018578a;
        }
        pEVar4 = local_60;
        iVar10 = (*local_60->_vptr_EbmlElement[4])(local_60);
        EbmlElement::SkipData
                  (pEVar4,inDataStream,
                   *(EbmlSemanticContext **)(CONCAT44(extraout_var_01,iVar10) + 0x18),
                   (EbmlElement *)0x0,false);
        if (bVar15 == 0 && local_60 != (EbmlElement *)0x0) {
LAB_0018570b:
          (*local_60->_vptr_EbmlElement[1])();
        }
      }
      iVar10 = *UpperEltFound;
      if (iVar10 < 1) {
        if (((iVar10 < 0) && (*UpperEltFound = iVar10 + 1, iVar10 != -1)) || (uVar16 == 0))
        goto LAB_001857cc;
        local_60 = EbmlStream::FindNextElement
                             (inDataStream,local_48,UpperEltFound,uVar16,SUB41(local_58,0),1);
      }
      else {
        *UpperEltFound = iVar10 + -1;
        if ((iVar10 != 1) || (uVar16 == 0)) goto LAB_001857cc;
        local_60 = *local_50;
      }
    } while (local_60 != (EbmlElement *)0x0);
  }
  if (0 < *UpperEltFound) {
LAB_001857c4:
    *local_50 = local_60;
  }
LAB_001857cc:
  ppEVar12 = (this->ElementList).
             super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar12 !=
      (this->ElementList).
      super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar10 = (*(*ppEVar12)->_vptr_EbmlElement[3])();
      if ((*(long *)(EbmlCrc32::ClassInfos._8_8_ + 8) ==
           *(long *)((int *)CONCAT44(extraout_var_02,iVar10) + 2)) &&
         (*(int *)EbmlCrc32::ClassInfos._8_8_ == *(int *)CONCAT44(extraout_var_02,iVar10))) {
        this->bChecksumUsed = true;
        pEVar4 = *ppEVar12;
        uVar2 = pEVar4->Size;
        uVar5 = *(undefined4 *)((long)&pEVar4->Size + 4);
        uVar3 = pEVar4->DefaultSize;
        uVar6 = *(undefined4 *)((long)&pEVar4->DefaultSize + 4);
        iVar10 = pEVar4->SizeLength;
        bVar8 = pEVar4->bSizeIsFinite;
        uVar9 = *(undefined3 *)&pEVar4->field_0x1d;
        uVar16 = pEVar4->ElementPosition;
        uVar7 = *(undefined8 *)((long)&pEVar4->SizePosition + 3);
        *(undefined8 *)
         ((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.ElementPosition + 3) =
             *(undefined8 *)((long)&pEVar4->ElementPosition + 3);
        *(undefined8 *)((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.SizePosition + 3)
             = uVar7;
        (this->Checksum).super_EbmlBinary.super_EbmlElement.SizeLength = iVar10;
        (this->Checksum).super_EbmlBinary.super_EbmlElement.bSizeIsFinite = bVar8;
        *(undefined3 *)&(this->Checksum).super_EbmlBinary.super_EbmlElement.field_0x1d = uVar9;
        (this->Checksum).super_EbmlBinary.super_EbmlElement.ElementPosition = uVar16;
        *(int *)&(this->Checksum).super_EbmlBinary.super_EbmlElement.Size = (int)uVar2;
        *(undefined4 *)((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.Size + 4) = uVar5
        ;
        *(int *)&(this->Checksum).super_EbmlBinary.super_EbmlElement.DefaultSize = (int)uVar3;
        *(undefined4 *)((long)&(this->Checksum).super_EbmlBinary.super_EbmlElement.DefaultSize + 4)
             = uVar6;
        (this->Checksum).super_EbmlBinary.Data = (binary *)pEVar4[1]._vptr_EbmlElement;
        uVar5 = *(undefined4 *)((long)&pEVar4[1].Size + 4);
        (this->Checksum).m_crc = *(undefined4 *)&pEVar4[1].Size;
        (this->Checksum).m_crc_final = uVar5;
        goto LAB_00185841;
      }
      ppEVar12 = ppEVar12 + 1;
    } while (ppEVar12 !=
             (this->ElementList).
             super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppEVar12 = (pointer)0x0;
LAB_00185841:
  if (this->bChecksumUsed == true) {
    if (*ppEVar12 != (EbmlElement *)0x0) {
      (*(*ppEVar12)->_vptr_EbmlElement[1])();
    }
    ppEVar13 = ppEVar12 + 1;
    ppEVar14 = (this->ElementList).
               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar13 != ppEVar14) {
      memmove(ppEVar12,ppEVar13,(long)ppEVar14 - (long)ppEVar13);
      ppEVar14 = (this->ElementList).
                 super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->ElementList).
    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar14 + -1;
  }
  (this->super_EbmlElement).bValueIsSet = true;
  return;
}

Assistant:

void EbmlMaster::Read(EbmlStream & inDataStream, const EbmlSemanticContext & sContext, int & UpperEltFound, EbmlElement * & FoundElt, bool AllowDummyElt, ScopeMode ReadFully)
{
  if (ReadFully == SCOPE_NO_DATA)
    return;

  EbmlElement * ElementLevelA;
  // remove all existing elements, including the mandatory ones...
  size_t Index;
  for (Index=0; Index<ElementList.size(); Index++) {
    if (!(*ElementList[Index]).IsLocked()) {
      delete ElementList[Index];
    }
  }
  ElementList.clear();
  uint64 MaxSizeToRead;

  if (IsFiniteSize())
    MaxSizeToRead = GetSize();
  else
    MaxSizeToRead = 0x7FFFFFFF;

  // read blocks and discard the ones we don't care about
  if (MaxSizeToRead > 0)
  {
    inDataStream.I_O().setFilePointer(GetSizePosition() + GetSizeLength(), seek_beginning);
    ElementLevelA = inDataStream.FindNextElement(sContext, UpperEltFound, MaxSizeToRead, AllowDummyElt);
    while (ElementLevelA != NULL && UpperEltFound <= 0 && MaxSizeToRead > 0) {
      if (IsFiniteSize() && ElementLevelA->IsFiniteSize())
        MaxSizeToRead = GetEndPosition() - ElementLevelA->GetEndPosition(); // even if it's the default value
      if (!AllowDummyElt && ElementLevelA->IsDummy()) {
        if (ElementLevelA->IsFiniteSize()) {
          ElementLevelA->SkipData(inDataStream, sContext);
          delete ElementLevelA; // forget this unknown element
        } else {
          delete ElementLevelA; // forget this unknown element
          break;
        }
      } else {
        ElementLevelA->Read(inDataStream, EBML_CONTEXT(ElementLevelA), UpperEltFound, FoundElt, AllowDummyElt, ReadFully);

        // Discard elements that couldn't be read properly if
        // SCOPE_ALL_DATA has been requested. This can happen
        // e.g. if block data is defective.
        bool DeleteElement = true;

        if (ElementLevelA->ValueIsSet() || (ReadFully != SCOPE_ALL_DATA)) {
          ElementList.push_back(ElementLevelA);
          DeleteElement = false;
        }

        // just in case
        if (ElementLevelA->IsFiniteSize()) {
          ElementLevelA->SkipData(inDataStream, EBML_CONTEXT(ElementLevelA));
          if (DeleteElement)
            delete ElementLevelA;
        } else {
          if (DeleteElement)
            delete ElementLevelA;

          if (UpperEltFound) {
            --UpperEltFound;
            if (UpperEltFound > 0 || MaxSizeToRead <= 0)
              goto processCrc;
            ElementLevelA = FoundElt;
          }

          break;
        }
      }

      if (UpperEltFound > 0) {
        UpperEltFound--;
        if (UpperEltFound > 0 || MaxSizeToRead <= 0)
          goto processCrc;
        ElementLevelA = FoundElt;
        continue;
      }

      if (UpperEltFound < 0) {
        UpperEltFound++;
        if (UpperEltFound < 0)
          goto processCrc;
      }

      if (MaxSizeToRead <= 0)
        goto processCrc;// this level is finished

      ElementLevelA = inDataStream.FindNextElement(sContext, UpperEltFound, MaxSizeToRead, AllowDummyElt);
    }
    if (UpperEltFound > 0) {
      FoundElt = ElementLevelA;
    }
  }
processCrc:

  EBML_MASTER_ITERATOR Itr, CrcItr;
  for (Itr = ElementList.begin(); Itr != ElementList.end();) {
    if ((EbmlId)(*(*Itr)) == EBML_ID(EbmlCrc32)) {
      bChecksumUsed = true;
      // remove the element
      Checksum = *(static_cast<EbmlCrc32*>(*Itr));
      CrcItr = Itr;
      break;
    }
    ++Itr;
  }

  if (bChecksumUsed)
  {
    delete *CrcItr;
    Remove(CrcItr);
  }

  SetValueIsSet();
}